

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O3

void __thiscall
Importer_isResolvedComponentOverTwoLevels_Test::TestBody
          (Importer_isResolvedComponentOverTwoLevels_Test *this)

{
  char cVar1;
  Message MVar2;
  char *pcVar3;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  ComponentPtr component;
  ModelPtr model;
  ImporterPtr importer;
  ParserPtr parser;
  long *local_a8;
  long *local_a0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  AssertionResult local_90;
  long local_80 [2];
  AssertHelper local_70 [8];
  long *local_68;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  long local_58 [2];
  string local_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  shared_ptr *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Parser::create(SUB81(local_28,0));
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"importer/component_importer.cellml","");
  fileContents((string *)&local_90);
  libcellml::Parser::parseModel(local_48);
  if ((long *)CONCAT71(local_90._1_7_,local_90.success_) != local_80) {
    operator_delete((long *)CONCAT71(local_90._1_7_,local_90.success_),local_80[0] + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  libcellml::Importer::create(SUB81(&local_38,0));
  cVar1 = libcellml::Model::hasUnresolvedImports();
  local_68 = (long *)CONCAT71(local_68._1_7_,cVar1);
  local_60.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar1 == '\0') {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(char *)&local_68,"model->hasUnresolvedImports()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x41d,(char *)CONCAT71(local_90._1_7_,local_90.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((long *)CONCAT71(local_90._1_7_,local_90.success_) != local_80) {
      operator_delete((long *)CONCAT71(local_90._1_7_,local_90.success_),local_80[0] + 1);
    }
    if (local_a0 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_a0 != (long *)0x0)) {
        (**(code **)(*local_a0 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"importer/","");
  resourcePath((string *)&local_90);
  libcellml::Importer::resolveImports(local_38,local_48);
  if ((long *)CONCAT71(local_90._1_7_,local_90.success_) != local_80) {
    operator_delete((long *)CONCAT71(local_90._1_7_,local_90.success_),local_80[0] + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  local_68 = (long *)0x2;
  local_a0 = (long *)libcellml::Importer::libraryCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_90,"size_t(2)","importer->libraryCount()",(unsigned_long *)&local_68
             ,(unsigned_long *)&local_a0);
  if (local_90.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (local_90.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_90.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x41f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    if (local_68 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_68 != (long *)0x0)) {
        (**(code **)(*local_68 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  libcellml::ComponentEntity::component((ulong)&local_68);
  MVar2 = (Message)libcellml::ImportedEntity::isResolved();
  local_98.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_a0._0_1_ = MVar2;
  if (MVar2 == (Message)0x0) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(char *)&local_a0,"component->isResolved()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x423,(char *)CONCAT71(local_90._1_7_,local_90.success_));
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    if ((long *)CONCAT71(local_90._1_7_,local_90.success_) != local_80) {
      operator_delete((long *)CONCAT71(local_90._1_7_,local_90.success_),local_80[0] + 1);
    }
    if (local_a8 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_a8 != (long *)0x0)) {
        (**(code **)(*local_a8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar1 = libcellml::Model::hasUnresolvedImports();
  local_a0 = (long *)(CONCAT71(local_a0._1_7_,cVar1) ^ 1);
  local_98.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar1 != '\0') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(char *)&local_a0,"model->hasUnresolvedImports()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x425,(char *)CONCAT71(local_90._1_7_,local_90.success_));
    testing::internal::AssertHelper::operator=(local_70,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    if ((long *)CONCAT71(local_90._1_7_,local_90.success_) != local_80) {
      operator_delete((long *)CONCAT71(local_90._1_7_,local_90.success_),local_80[0] + 1);
    }
    if (local_a8 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_a8 != (long *)0x0)) {
        (**(code **)(*local_a8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_60.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60.ptr_);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Importer, isResolvedComponentOverTwoLevels)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/component_importer.cellml"));
    auto importer = libcellml::Importer::create();

    EXPECT_TRUE(model->hasUnresolvedImports());
    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(2), importer->libraryCount());

    auto component = model->component(0);

    EXPECT_TRUE(component->isResolved());

    EXPECT_FALSE(model->hasUnresolvedImports());
}